

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MammalHandler.cpp
# Opt level: O0

void __thiscall MammalHandler::handleRequest(MammalHandler *this,string *name)

{
  AnimalHandler *pAVar1;
  bool bVar2;
  __type _Var3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pbVar4;
  string local_80 [48];
  string local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *name_local;
  MammalHandler *this_local;
  
  this_00 = &(this->super_AnimalHandler).nameList;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&local_30), bVar2) {
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_50,(string *)pbVar4);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,name);
    if (_Var3) {
      std::operator<<((ostream *)&std::cout,"class::MammalHandler  method::handleRequest\n");
    }
    std::__cxx11::string::~string(local_50);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  if ((this->super_AnimalHandler).myHandler != (AnimalHandler *)0x0) {
    pAVar1 = (this->super_AnimalHandler).myHandler;
    std::__cxx11::string::string(local_80,(string *)name);
    (*pAVar1->_vptr_AnimalHandler[2])(pAVar1,local_80);
    std::__cxx11::string::~string(local_80);
  }
  return;
}

Assistant:

void MammalHandler::handleRequest(std::string name) {
    for (auto i : nameList) {
        if (i == name) {
            std::cout << "class::MammalHandler  method::handleRequest\n";
        }
    }
    if (myHandler != nullptr) {
        myHandler->handleRequest(name);
    }
}